

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint HuffmanTree_makeFromLengths(HuffmanTree *tree,uint *bitlen,size_t numcodes,uint maxbitlen)

{
  uint *puVar1;
  uint uVar2;
  ulong uVar3;
  
  puVar1 = (uint *)malloc(numcodes * 4);
  tree->lengths = puVar1;
  if (puVar1 != (uint *)0x0) {
    for (uVar2 = 0; uVar3 = (ulong)uVar2, uVar3 != numcodes; uVar2 = uVar2 + 1) {
      puVar1[uVar3] = bitlen[uVar3];
    }
    tree->numcodes = (uint)numcodes;
    tree->maxbitlen = maxbitlen;
    uVar2 = HuffmanTree_makeFromLengths2(tree);
    return uVar2;
  }
  return 0x53;
}

Assistant:

static unsigned HuffmanTree_makeFromLengths(HuffmanTree* tree, const unsigned* bitlen,
                                            size_t numcodes, unsigned maxbitlen)
{
  unsigned i;
  tree->lengths = (unsigned*)lodepng_malloc(numcodes * sizeof(unsigned));
  if(!tree->lengths) return 83; /*alloc fail*/
  for(i = 0; i != numcodes; ++i) tree->lengths[i] = bitlen[i];
  tree->numcodes = (unsigned)numcodes; /*number of symbols*/
  tree->maxbitlen = maxbitlen;
  return HuffmanTree_makeFromLengths2(tree);
}